

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absGlaOld.c
# Opt level: O1

void Gia_ManRefSetAndPropFanout_rec(Gla_Man_t *p,Gia_Obj_t *pObj,int f,Vec_Int_t *vSelect,int Sign)

{
  Gia_Obj_t *pGVar1;
  Vec_Int_t *pVVar2;
  int *piVar3;
  Gia_Obj_t *pGVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  ulong uVar10;
  uint uVar11;
  Gia_Man_t *pGVar12;
  char *__function;
  uint uVar13;
  int Fill;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  ulong extraout_RDX_01;
  uint uVar14;
  Gia_Obj_t *pGVar15;
  char *__file;
  char *__assertion;
  int iVar16;
  Vec_Int_t *pVVar17;
  long lVar18;
  ulong uVar19;
  
  uVar10 = (ulong)(uint)f;
  uVar19 = (ulong)(uint)f;
  while( true ) {
    pGVar15 = p->pGia->pObjs;
    if ((pObj < pGVar15) || (pGVar15 + p->pGia->nObjs <= pObj)) goto LAB_0057fdc3;
    pVVar17 = p->pvRefis + (int)((ulong)((long)pObj - (long)pGVar15) >> 2) * -0x55555555;
    iVar9 = (int)uVar19;
    uVar14 = iVar9 + 1;
    Vec_IntFillExtra(pVVar17,uVar14,(int)uVar10);
    if ((iVar9 < 0) || (pVVar17->nSize <= iVar9)) goto LAB_0057fefd;
    uVar8 = pVVar17->pArray[uVar19];
    if ((uVar8 >> 0x13 & 0xfff) != Sign) {
      return;
    }
    if ((uVar8 & 2) != 0) {
      __assert_fail("pRef->fVisit == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absGlaOld.c"
                    ,0x126,
                    "void Gia_ManRefSetAndPropFanout_rec(Gla_Man_t *, Gia_Obj_t *, int, Vec_Int_t *, int)"
                   );
    }
    uVar10 = (ulong)(uVar8 | 2);
    pVVar17->pArray[uVar19] = uVar8 | 2;
    if ((uVar8 & 4) != 0) {
      if ((uVar8 & 0x7fff8) == 0) {
        __assert_fail("(int)pRef->Prio > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absGlaOld.c"
                      ,0x12a,
                      "void Gia_ManRefSetAndPropFanout_rec(Gla_Man_t *, Gia_Obj_t *, int, Vec_Int_t *, int)"
                     );
      }
      lVar18 = (long)p->pPars->iFrame;
      if (-1 < lVar18) goto LAB_0057fdff;
      goto LAB_0057fe91;
    }
    uVar10 = *(ulong *)pObj;
    uVar8 = (uint)uVar10;
    if (((uVar10 & 0x1fffffff) != 0x1fffffff && (int)uVar8 < 0) && (iVar9 == p->pPars->iFrame)) {
      return;
    }
    pGVar12 = p->pGia;
    iVar6 = (int)(uVar10 & 0x1fffffff);
    bVar5 = iVar6 == 0x1fffffff || -1 < (int)uVar8;
    uVar13 = (uint)(uVar10 >> 0x20);
    if (bVar5) break;
    if ((int)(uVar13 & 0x1fffffff) < pGVar12->vCos->nSize - pGVar12->nRegs) {
      return;
    }
    if ((bVar5) || ((int)(uVar13 & 0x1fffffff) < pGVar12->vCos->nSize - pGVar12->nRegs)) break;
    pObj = Gia_ObjRiToRo(pGVar12,pObj);
    pGVar15 = p->pGia->pObjs;
    if ((pObj < pGVar15) || (pGVar15 + p->pGia->nObjs <= pObj)) goto LAB_0057fdc3;
    pVVar2 = p->pvRefis;
    iVar6 = (int)((ulong)((long)pObj - (long)pGVar15) >> 2) * -0x55555555;
    pVVar17 = pVVar2 + iVar6;
    Vec_IntFillExtra(pVVar17,iVar9 + 2,Fill);
    if (pVVar2[iVar6].nSize <= (int)uVar14) goto LAB_0057fefd;
    uVar19 = (ulong)uVar14;
    uVar10 = extraout_RDX;
    if ((*(byte *)(pVVar17->pArray + uVar14) & 2) != 0) {
      return;
    }
  }
  if ((~uVar8 & 0x9fffffff) == 0) {
    if (((int)uVar8 < 0 || iVar6 == 0x1fffffff) &&
       ((int)(uVar13 & 0x1fffffff) < pGVar12->vCis->nSize - pGVar12->nRegs)) {
LAB_0057ff71:
      __assert_fail("Gia_ObjIsRo(p->pGia, pObj) || Gia_ObjIsAnd(pObj)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absGlaOld.c"
                    ,0x13a,
                    "void Gia_ManRefSetAndPropFanout_rec(Gla_Man_t *, Gia_Obj_t *, int, Vec_Int_t *, int)"
                   );
    }
  }
  else if (((int)uVar8 < 0) || (iVar6 == 0x1fffffff)) goto LAB_0057ff71;
  pGVar12 = p->pGia;
  pGVar15 = pGVar12->pObjs;
  if (pGVar15 <= pObj) {
    iVar6 = iVar9 + 1;
    iVar16 = 0;
    while (pObj < pGVar15 + pGVar12->nObjs) {
      uVar14 = (int)((long)pObj - (long)pGVar15 >> 2) * -0x55555555;
      if (((int)uVar14 < 0) || (pGVar12->vFanoutNums->nSize <= (int)uVar14)) {
LAB_0057fede:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      if (pGVar12->vFanoutNums->pArray[uVar14 & 0x7fffffff] <= iVar16) {
        return;
      }
      iVar7 = pGVar12->vFanout->nSize;
      if (iVar7 <= (int)uVar14) goto LAB_0057fede;
      piVar3 = pGVar12->vFanout->pArray;
      uVar14 = piVar3[uVar14 & 0x7fffffff] + iVar16;
      if (((int)uVar14 < 0) || (iVar7 <= (int)uVar14)) goto LAB_0057fede;
      iVar7 = piVar3[uVar14];
      lVar18 = (long)iVar7;
      if ((lVar18 < 0) || (pGVar12->nObjs <= iVar7)) {
        __assertion = "v >= 0 && v < p->nObjs";
        __file = 
        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
        ;
        __function = "Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)";
        goto LAB_0057ff29;
      }
      pVVar2 = p->pvRefis;
      pVVar17 = pVVar2 + lVar18;
      Vec_IntFillExtra(pVVar17,iVar6,uVar14);
      if (pVVar2[lVar18].nSize <= iVar9) goto LAB_0057fefd;
      if ((*(byte *)(pVVar17->pArray + uVar19) & 2) == 0) {
        pGVar15 = pGVar15 + lVar18;
        iVar7 = (int)*(ulong *)pGVar15;
        uVar10 = *(ulong *)pGVar15 & 0x1fffffff;
        if (-1 < iVar7 || uVar10 == 0x1fffffff) {
          if ((iVar7 < 0) || ((int)uVar10 == 0x1fffffff)) {
            __assert_fail("Gia_ObjIsAnd(pFanout)",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absGlaOld.c"
                          ,0x145,
                          "void Gia_ManRefSetAndPropFanout_rec(Gla_Man_t *, Gia_Obj_t *, int, Vec_Int_t *, int)"
                         );
          }
          pGVar1 = pGVar15 + -uVar10;
          pGVar4 = p->pGia->pObjs;
          if ((pGVar1 < pGVar4) || (pGVar4 + p->pGia->nObjs <= pGVar1)) break;
          pVVar2 = p->pvRefis;
          iVar7 = (int)((ulong)((long)pGVar1 - (long)pGVar4) >> 2) * -0x55555555;
          pVVar17 = pVVar2 + iVar7;
          Vec_IntFillExtra(pVVar17,iVar6,(int)(pGVar4 + p->pGia->nObjs));
          if (pVVar2[iVar7].nSize <= iVar9) goto LAB_0057fefd;
          pGVar1 = pGVar15 + -(ulong)(*(uint *)&pGVar15->field_0x4 & 0x1fffffff);
          pGVar4 = p->pGia->pObjs;
          if ((pGVar1 < pGVar4) || (pGVar4 + p->pGia->nObjs <= pGVar1)) break;
          piVar3 = pVVar17->pArray;
          pVVar2 = p->pvRefis;
          iVar7 = (int)((ulong)((long)pGVar1 - (long)pGVar4) >> 2) * -0x55555555;
          pVVar17 = pVVar2 + iVar7;
          Vec_IntFillExtra(pVVar17,iVar6,(int)(pGVar4 + p->pGia->nObjs));
          if (pVVar2[iVar7].nSize <= iVar9) goto LAB_0057fefd;
          uVar14 = piVar3[uVar19];
          uVar8 = (uint)(*(ulong *)pGVar15 >> 0x1d) & 7 ^ uVar14;
          if (((uVar14 & 2) == 0) || ((uVar8 & 1) != 0)) {
            uVar13 = pVVar17->pArray[uVar19];
            uVar11 = (uint)(*(ulong *)pGVar15 >> 0x3d) ^ uVar13;
            if ((((uVar13 & 2) == 0) || ((uVar11 & 1) != 0)) &&
               (((uVar14 & uVar13 & 2) == 0 || ((uVar8 & uVar11 & 1) == 0)))) goto LAB_0057fda9;
          }
        }
        Gia_ManRefSetAndPropFanout_rec(p,pGVar15,iVar9,vSelect,Sign);
      }
LAB_0057fda9:
      iVar16 = iVar16 + 1;
      pGVar12 = p->pGia;
      pGVar15 = pGVar12->pObjs;
      if (pObj < pGVar15) break;
    }
  }
LAB_0057fdc3:
  __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                ,0x1b7,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
  while( true ) {
    pVVar2 = p->pvRefis;
    iVar9 = (int)((ulong)((long)pObj - (long)pGVar15) >> 2) * -0x55555555;
    pVVar17 = pVVar2 + iVar9;
    Vec_IntFillExtra(pVVar17,(int)lVar18 + 1,(int)uVar10);
    if (pVVar2[iVar9].nSize <= lVar18) goto LAB_0057fefd;
    uVar10 = extraout_RDX_00;
    if ((*(byte *)(pVVar17->pArray + lVar18) & 2) == 0) {
      Gia_ManRefSetAndPropFanout_rec(p,pObj,(int)lVar18,vSelect,Sign);
      uVar10 = extraout_RDX_01;
    }
    bVar5 = lVar18 < 1;
    lVar18 = lVar18 + -1;
    if (bVar5) break;
LAB_0057fdff:
    pGVar15 = p->pGia->pObjs;
    if ((pObj < pGVar15) || (pGVar15 + p->pGia->nObjs <= pObj)) goto LAB_0057fdc3;
  }
LAB_0057fe91:
  pGVar15 = p->pGia->pObjs;
  if ((pGVar15 <= pObj) && (pObj < pGVar15 + p->pGia->nObjs)) {
    Vec_IntPush(vSelect,(int)((ulong)((long)pObj - (long)pGVar15) >> 2) * -0x55555555);
    return;
  }
  goto LAB_0057fdc3;
LAB_0057fefd:
  __assertion = "i >= 0 && i < p->nSize";
  __file = 
  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
  ;
  __function = "int *Vec_IntEntryP(Vec_Int_t *, int)";
LAB_0057ff29:
  __assert_fail(__assertion,__file,0x1af,__function);
}

Assistant:

void Gia_ManRefSetAndPropFanout_rec( Gla_Man_t * p, Gia_Obj_t * pObj, int f, Vec_Int_t * vSelect, int Sign )
{
    int i;//, Id = Gia_ObjId(p->pGia, pObj);
    Rfn_Obj_t * pRef0, * pRef1, * pRef = Gla_ObjRef( p, pObj, f );
    Gia_Obj_t * pFanout;
    int k;
    if ( (int)pRef->Sign != Sign )
        return;
    assert( pRef->fVisit == 0 );
    pRef->fVisit = 1;
    if ( pRef->fPPi )
    {
        assert( (int)pRef->Prio > 0 );
        for ( i = p->pPars->iFrame; i >= 0; i-- )
            if ( !Gla_ObjRef(p, pObj, i)->fVisit )
                Gia_ManRefSetAndPropFanout_rec( p, pObj, i, vSelect, Sign );
        Vec_IntPush( vSelect, Gia_ObjId(p->pGia, pObj) );
        return;
    }
    if ( (Gia_ObjIsCo(pObj) && f == p->pPars->iFrame) || Gia_ObjIsPo(p->pGia, pObj) )
        return;
    if ( Gia_ObjIsRi(p->pGia, pObj) )
    {
        pFanout = Gia_ObjRiToRo(p->pGia, pObj);
        if ( !Gla_ObjRef(p, pFanout, f+1)->fVisit )
            Gia_ManRefSetAndPropFanout_rec( p, pFanout, f+1, vSelect, Sign );
        return;
    }
    assert( Gia_ObjIsRo(p->pGia, pObj) || Gia_ObjIsAnd(pObj) );
    Gia_ObjForEachFanoutStatic( p->pGia, pObj, pFanout, k )
    {
//        Rfn_Obj_t * pRefF = Gla_ObjRef(p, pFanout, f);
        if ( Gla_ObjRef(p, pFanout, f)->fVisit )
            continue;
        if ( Gia_ObjIsCo(pFanout) )
        {
            Gia_ManRefSetAndPropFanout_rec( p, pFanout, f, vSelect, Sign );
            continue;
        } 
        assert( Gia_ObjIsAnd(pFanout) );
        pRef0 = Gla_ObjRef( p, Gia_ObjFanin0(pFanout), f );
        pRef1 = Gla_ObjRef( p, Gia_ObjFanin1(pFanout), f );
        if ( ((pRef0->Value ^ Gia_ObjFaninC0(pFanout)) == 0 && pRef0->fVisit) ||
             ((pRef1->Value ^ Gia_ObjFaninC1(pFanout)) == 0 && pRef1->fVisit) || 
           ( ((pRef0->Value ^ Gia_ObjFaninC0(pFanout)) == 1 && pRef0->fVisit) && 
             ((pRef1->Value ^ Gia_ObjFaninC1(pFanout)) == 1 && pRef1->fVisit) ) )
           Gia_ManRefSetAndPropFanout_rec( p, pFanout, f, vSelect, Sign );
    }
}